

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# if_conversion.cpp
# Opt level: O1

bool __thiscall
spvtools::opt::IfConversion::CanHoistInstruction
          (IfConversion *this,Instruction *inst,BasicBlock *target_block,
          DominatorAnalysis *dominators)

{
  Instruction *pIVar1;
  IRContext *this_00;
  DefUseManager *pDVar2;
  pointer pOVar3;
  uint **ppuVar4;
  bool bVar5;
  bool bVar6;
  char cVar7;
  uint32_t a;
  uint32_t b;
  BasicBlock *pBVar8;
  uint **ppuVar9;
  pointer pOVar10;
  undefined8 *local_68;
  undefined8 uStack_60;
  code *local_58;
  code *pcStack_50;
  DominatorTree *local_40;
  uint *local_38;
  
  pBVar8 = IRContext::get_instr_block((this->super_Pass).context_,inst);
  bVar5 = true;
  if (pBVar8 != (BasicBlock *)0x0) {
    if (target_block != (BasicBlock *)0x0) {
      pIVar1 = (pBVar8->label_)._M_t.
               super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
               .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
      b = 0;
      a = 0;
      local_40 = (DominatorTree *)dominators;
      if (pIVar1->has_result_id_ == true) {
        a = Instruction::GetSingleWordOperand(pIVar1,(uint)pIVar1->has_type_id_);
      }
      pIVar1 = (target_block->label_)._M_t.
               super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
               .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
      if (pIVar1->has_result_id_ == true) {
        b = Instruction::GetSingleWordOperand(pIVar1,(uint)pIVar1->has_type_id_);
      }
      dominators = (DominatorAnalysis *)local_40;
      bVar5 = DominatorTree::Dominates(local_40,a,b);
      if (bVar5) {
        return true;
      }
    }
    bVar5 = Instruction::IsOpcodeCodeMotionSafe(inst);
    if (bVar5) {
      this_00 = (this->super_Pass).context_;
      if ((this_00->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
        IRContext::BuildDefUseManager(this_00);
      }
      pDVar2 = (this_00->def_use_mgr_)._M_t.
               super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
               .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl;
      local_58 = (code *)0x0;
      pcStack_50 = (code *)0x0;
      local_68 = (undefined8 *)0x0;
      uStack_60 = 0;
      local_68 = (undefined8 *)operator_new(0x20);
      *local_68 = this;
      local_68[1] = target_block;
      local_68[2] = pDVar2;
      local_68[3] = dominators;
      pcStack_50 = std::
                   _Function_handler<bool_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/if_conversion.cpp:290:7)>
                   ::_M_invoke;
      local_58 = std::
                 _Function_handler<bool_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/if_conversion.cpp:290:7)>
                 ::_M_manager;
      pOVar10 = (inst->operands_).
                super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pOVar3 = (inst->operands_).
               super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      bVar5 = pOVar10 == pOVar3;
      if (!bVar5) {
        bVar5 = false;
        do {
          bVar6 = spvIsInIdType(pOVar10->type);
          if (bVar6) {
            ppuVar4 = (uint **)(pOVar10->words).large_data_._M_t.
                               super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                               .
                               super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                               ._M_head_impl;
            ppuVar9 = &(pOVar10->words).small_data_;
            if (ppuVar4 != (uint **)0x0) {
              ppuVar9 = ppuVar4;
            }
            local_38 = *ppuVar9;
            if (local_58 == (code *)0x0) {
              std::__throw_bad_function_call();
            }
            cVar7 = (*pcStack_50)(&local_68,&local_38);
            if (cVar7 == '\0') break;
          }
          pOVar10 = pOVar10 + 1;
          bVar5 = pOVar10 == pOVar3;
        } while (!bVar5);
      }
      if (local_58 != (code *)0x0) {
        (*local_58)(&local_68,&local_68,3);
      }
    }
    else {
      bVar5 = false;
    }
  }
  return bVar5;
}

Assistant:

bool IfConversion::CanHoistInstruction(Instruction* inst,
                                       BasicBlock* target_block,
                                       DominatorAnalysis* dominators) {
  BasicBlock* inst_block = context()->get_instr_block(inst);
  if (!inst_block) {
    // This is in the header, and dominates everything.
    return true;
  }

  if (dominators->Dominates(inst_block, target_block)) {
    // Already in position.  No work to do.
    return true;
  }

  if (!inst->IsOpcodeCodeMotionSafe()) {
    return false;
  }

  // Check all instruction |inst| depends on.
  analysis::DefUseManager* def_use_mgr = context()->get_def_use_mgr();
  return inst->WhileEachInId(
      [this, target_block, def_use_mgr, dominators](uint32_t* id) {
        Instruction* operand_inst = def_use_mgr->GetDef(*id);
        return CanHoistInstruction(operand_inst, target_block, dominators);
      });
}